

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O3

void __thiscall
r_exec::Group::inject_hlps
          (Group *this,vector<r_exec::View_*,_std::allocator<r_exec::View_*>_> *views)

{
  atomic_int_fast64_t *paVar1;
  _Object *p_Var2;
  View *pVVar3;
  View *pVVar4;
  MDLController *pMVar5;
  CSTController *pCVar6;
  char cVar7;
  ushort uVar8;
  int iVar9;
  undefined4 extraout_var;
  long lVar10;
  mapped_type *pmVar11;
  MDLController *pMVar12;
  Group *pGVar13;
  CSTController *this_00;
  ulong uVar14;
  _Rb_tree_node_base *p_Var15;
  pointer ppVVar16;
  pointer ppVVar17;
  float fVar18;
  undefined4 uVar19;
  undefined1 auVar20 [16];
  bool inject_in_secondary_group;
  Atom a;
  DebugStream local_e9;
  pthread_mutex_t *local_e8;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_e0;
  char *local_d8;
  long local_d0;
  char local_c8 [20];
  undefined4 local_b4;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  local_e8 = (pthread_mutex_t *)&this->mutex;
  iVar9 = pthread_mutex_lock(local_e8);
  if (iVar9 != 0) {
    std::__throw_system_error(iVar9);
  }
  ppVVar16 = (views->super__Vector_base<r_exec::View_*,_std::allocator<r_exec::View_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if (ppVVar16 !=
      (views->super__Vector_base<r_exec::View_*,_std::allocator<r_exec::View_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_e0 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->ipgm_views;
    do {
      p_Var2 = ((*ppVVar16)->super_View).object.object;
      iVar9 = (*p_Var2->_vptr__Object[4])(p_Var2,0);
      local_b4 = *(undefined4 *)CONCAT44(extraout_var,iVar9);
      cVar7 = r_code::Atom::getDescriptor();
      if (cVar7 == -0x33) {
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"group inject hlp","");
        local_d8 = local_c8;
        std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_90,local_90 + local_88);
        iVar9 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
        if (iVar9 != 0) {
          std::__throw_system_error(iVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_d8,local_d0);
        if (local_d8 != local_c8) {
          operator_delete(local_d8);
        }
        lVar10 = (*Now)();
        auVar20 = r_code::Utils::GetTimeReference();
        DebugStream::timestamp_abi_cxx11_
                  (&local_50,(DebugStream *)(lVar10 - auVar20._0_8_),auVar20._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," -> cst ",8);
        (*(((*ppVVar16)->super_View).object.object)->_vptr__Object[2])();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        DebugStream::~DebugStream(&local_e9);
        if (local_90 != local_80) {
          operator_delete(local_90);
        }
        pVVar3 = *ppVVar16;
        local_d8 = (char *)r_exec::View::get_oid(pVVar3);
        pmVar11 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](local_e0,(key_type *)&local_d8);
        pVVar4 = (View *)pmVar11->object;
        if (pVVar4 != pVVar3) {
          if (pVVar4 != (View *)0x0) {
            LOCK();
            paVar1 = &(pVVar4->super_View).super__Object.refCount;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if ((pVVar4->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
              (*(pVVar4->super_View).super__Object._vptr__Object[1])();
            }
          }
          pmVar11->object = (_Object *)pVVar3;
          LOCK();
          paVar1 = &(pVVar3->super_View).super__Object.refCount;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
        }
        this_00 = (CSTController *)operator_new(0x1e8);
        CSTController::CSTController(this_00,&(*ppVVar16)->super_View);
        pVVar3 = *ppVVar16;
        pCVar6 = (CSTController *)(pVVar3->controller).object;
        if (pCVar6 != this_00) {
          if (pCVar6 != (CSTController *)0x0) {
            LOCK();
            paVar1 = &(pCVar6->super_HLPController).super_OController.super_Controller.super__Object
                      .refCount;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if ((pCVar6->super_HLPController).super_OController.super_Controller.super__Object.
                refCount.super___atomic_base<long>._M_i < 1) {
              (*(pCVar6->super_HLPController).super_OController.super_Controller.super__Object.
                _vptr__Object[1])();
            }
          }
          (pVVar3->controller).object = (_Object *)this_00;
          LOCK();
          paVar1 = &(this_00->super_HLPController).super_OController.super_Controller.super__Object.
                    refCount;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
        }
        pGVar13 = get_secondary_group(this);
        CSTController::set_secondary_host(this_00,pGVar13);
      }
      else if (cVar7 == -0x32) {
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"group inject hlp","");
        local_d8 = local_c8;
        std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_b0,local_b0 + local_a8);
        iVar9 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
        if (iVar9 != 0) {
          std::__throw_system_error(iVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_d8,local_d0);
        if (local_d8 != local_c8) {
          operator_delete(local_d8);
        }
        lVar10 = (*Now)();
        auVar20 = r_code::Utils::GetTimeReference();
        DebugStream::timestamp_abi_cxx11_
                  (&local_70,(DebugStream *)(lVar10 - auVar20._0_8_),auVar20._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," -> mdl ",8);
        (*(((*ppVVar16)->super_View).object.object)->_vptr__Object[2])();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        DebugStream::~DebugStream(&local_e9);
        if (local_b0 != local_a0) {
          operator_delete(local_b0);
        }
        pVVar3 = *ppVVar16;
        local_d8 = (char *)r_exec::View::get_oid(pVVar3);
        pmVar11 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](local_e0,(key_type *)&local_d8);
        pVVar4 = (View *)pmVar11->object;
        if (pVVar4 != pVVar3) {
          if (pVVar4 != (View *)0x0) {
            LOCK();
            paVar1 = &(pVVar4->super_View).super__Object.refCount;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if ((pVVar4->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
              (*(pVVar4->super_View).super__Object._vptr__Object[1])();
            }
          }
          pmVar11->object = (_Object *)pVVar3;
          LOCK();
          paVar1 = &(pVVar3->super_View).super__Object.refCount;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
        }
        pMVar12 = MDLController::New(*ppVVar16,(bool *)&local_d8);
        pVVar3 = *ppVVar16;
        pMVar5 = (MDLController *)(pVVar3->controller).object;
        if (pMVar5 != pMVar12) {
          if (pMVar5 != (MDLController *)0x0) {
            LOCK();
            paVar1 = &(pMVar5->super_HLPController).super_OController.super_Controller.super__Object
                      .refCount;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if ((pMVar5->super_HLPController).super_OController.super_Controller.super__Object.
                refCount.super___atomic_base<long>._M_i < 1) {
              (*(pMVar5->super_HLPController).super_OController.super_Controller.super__Object.
                _vptr__Object[1])();
            }
          }
          (pVVar3->controller).object = (_Object *)pMVar12;
          if (pMVar12 != (MDLController *)0x0) {
            LOCK();
            paVar1 = &(pMVar12->super_HLPController).super_OController.super_Controller.
                      super__Object.refCount;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
            UNLOCK();
          }
        }
        if (local_d8._0_1_ == (string)0x1) {
          pGVar13 = get_secondary_group(this);
          inject_secondary_mdl_controller(pGVar13,*ppVVar16);
        }
      }
      pVVar3 = *ppVVar16;
      uVar14 = (*Now)();
      uVar8 = r_code::Atom::asIndex();
      r_code::Utils::SetTimestamp
                ((Atom *)((long)(pVVar3->super_View).references + (ulong)uVar8 * 4 + 0x18),uVar14);
      r_code::Atom::~Atom((Atom *)&local_b4);
      ppVVar16 = ppVVar16 + 1;
    } while (ppVVar16 !=
             (views->super__Vector_base<r_exec::View_*,_std::allocator<r_exec::View_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
    ppVVar17 = (views->super__Vector_base<r_exec::View_*,_std::allocator<r_exec::View_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if (ppVVar16 != ppVVar17) {
      do {
        fVar18 = r_exec::View::get_act(*ppVVar17);
        local_e0 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)CONCAT44(local_e0._4_4_,fVar18);
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,3);
        fVar18 = (float)r_code::Atom::asFloat();
        if (fVar18 < local_e0._0_4_) {
          (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[5])(this,5);
          uVar19 = r_code::Atom::asFloat();
          local_e0 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)CONCAT44(local_e0._4_4_,uVar19);
          (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[5])(this,6);
          fVar18 = (float)r_code::Atom::asFloat();
          if (fVar18 < local_e0._0_4_) {
            (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[5])(this,7);
            uVar19 = r_code::Atom::asFloat();
            local_e0 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)CONCAT44(local_e0._4_4_,uVar19);
            (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[5])(this,8);
            fVar18 = (float)r_code::Atom::asFloat();
            if (fVar18 < local_e0._0_4_) {
              (*(((*ppVVar17)->controller).object)->_vptr__Object[5])();
              for (p_Var15 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_left;
                  (_Rb_tree_header *)p_Var15 !=
                  &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
                  p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
                Controller::_take_input
                          ((Controller *)((*ppVVar17)->controller).object,*(View **)(p_Var15 + 1));
              }
            }
          }
        }
        ppVVar17 = ppVVar17 + 1;
      } while (ppVVar17 !=
               (views->super__Vector_base<r_exec::View_*,_std::allocator<r_exec::View_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  pthread_mutex_unlock(local_e8);
  return;
}

Assistant:

void Group::inject_hlps(std::vector<View *> &views)
{
    std::lock_guard<std::mutex> guard(mutex);
    std::vector<View *>::const_iterator view;

    for (view = views.begin(); view != views.end(); ++view) {
        Atom a = (*view)->object->code(0);

        switch (a.getDescriptor()) {
        case Atom::COMPOSITE_STATE: {
            debug("group inject hlp") << DebugStream::timestamp(Now() - Utils::GetTimeReference()) << " -> cst " << (*view)->object->get_oid();
            ipgm_views[(*view)->get_oid()] = *view;
            CSTController *c = new CSTController(*view);
            (*view)->controller = c;
            c->set_secondary_host(get_secondary_group());
            break;
        }

        case Atom::MODEL: {
            debug("group inject hlp") << DebugStream::timestamp(Now() - Utils::GetTimeReference()) << " -> mdl " << (*view)->object->get_oid();
            ipgm_views[(*view)->get_oid()] = *view;
            bool inject_in_secondary_group;
            MDLController *c = MDLController::New(*view, inject_in_secondary_group);
            (*view)->controller = c;

            if (inject_in_secondary_group) {
                get_secondary_group()->inject_secondary_mdl_controller(*view);
            }

            break;
        }
        }

        (*view)->set_ijt(Now());
    }

    for (view = views.begin(); view != views.end(); ++view) {
        if (is_active_pgm(*view)) {
            (*view)->controller->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                (*view)->controller->_take_input(*v);    // view will be copied.
            }
        }
    }
}